

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvk_algorithm.c
# Opt level: O2

void fvk_c(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  solver_state_c s;
  
  setup_simple_state_c(&two_dof_robot_c,&s);
  *(undefined4 *)s.q = 0;
  *(undefined4 *)((long)s.q + 4) = 0x3ff00000;
  *(undefined4 *)(s.q + 1) = 0;
  *(undefined4 *)((long)s.q + 0xc) = 0x3ff00000;
  *(undefined4 *)s.qd = 0;
  *(undefined4 *)((long)s.qd + 4) = 0x3ff00000;
  *(undefined4 *)(s.qd + 1) = 0;
  *(undefined4 *)((long)s.qd + 0xc) = 0x3ff00000;
  lVar4 = 0x10;
  lVar6 = 0;
  lVar2 = 0;
  for (lVar1 = 1; lVar1 <= s.nbody; lVar1 = lVar1 + 1) {
    lVar5 = _ga_pose_compose + lVar4;
    lVar3 = (long)*(int *)(_ga_pose_compose + lVar4) * 0x40;
    (**(code **)(&kcc_joint + lVar3))(lVar5,(long)s.q + lVar6,(long)&(s.x_jnt)->rotation + lVar2);
    gc_pose_compose((long)&(s.x_jnt)->rotation + lVar2,_ga_pose_compose + lVar4 + -0x10,
                    (long)&(s.x_rel)->rotation + lVar2);
    (**(code **)(&two_dof_robot_a + lVar3))
              (lVar5,(long)s.qd + lVar6,(long)&(s.xd_jnt)->angular_velocity + lVar2);
    gc_twist_tf_ref_to_tgt
              ((long)&(s.x_rel)->rotation + lVar2,(long)&(s.xd)->angular_velocity + lVar2,
               (long)&(s.xd_tf)->angular_velocity + lVar2);
    gc_twist_accumulate((long)&(s.xd_tf)->angular_velocity + lVar2,
                        (long)&(s.xd_jnt)->angular_velocity + lVar2,
                        (long)&s.xd[1].angular_velocity + lVar2);
    lVar6 = lVar6 + 8;
    lVar4 = lVar4 + 0x90;
    lVar2 = lVar2 + 0x10;
  }
  gc_twist_log(s.xd + s.nbody);
  return;
}

Assistant:

void fvk_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);
    }

    gc_twist_log(&s.xd[s.nbody]);
}